

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChNodeFEAxyzDD.h
# Opt level: O3

void __thiscall
chrono::fea::ChNodeFEAxyzDD::LoadableGetVariables
          (ChNodeFEAxyzDD *this,
          vector<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_> *mvars)

{
  pointer *pppCVar1;
  int iVar2;
  undefined4 extraout_var;
  iterator iVar3;
  ChVariables *local_18;
  
  iVar2 = (*(this->super_ChNodeFEAxyzD).super_ChNodeFEAxyz.super_ChNodeFEAbase._vptr_ChNodeFEAbase
            [8])();
  local_18 = (ChVariables *)CONCAT44(extraout_var,iVar2);
  iVar3._M_current =
       (mvars->super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar3._M_current ==
      (mvars->super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<chrono::ChVariables*,std::allocator<chrono::ChVariables*>>::
    _M_realloc_insert<chrono::ChVariables*>
              ((vector<chrono::ChVariables*,std::allocator<chrono::ChVariables*>> *)mvars,iVar3,
               &local_18);
    iVar3._M_current =
         (mvars->super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>).
         _M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    *iVar3._M_current = local_18;
    iVar3._M_current =
         (mvars->super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>).
         _M_impl.super__Vector_impl_data._M_finish + 1;
    (mvars->super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>).
    _M_impl.super__Vector_impl_data._M_finish = iVar3._M_current;
  }
  local_18 = *(ChVariables **)&(this->super_ChNodeFEAxyzD).super_ChNodeFEAxyz.field_0xe8;
  if (iVar3._M_current ==
      (mvars->super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<chrono::ChVariables*,std::allocator<chrono::ChVariables*>>::
    _M_realloc_insert<chrono::ChVariables*>
              ((vector<chrono::ChVariables*,std::allocator<chrono::ChVariables*>> *)mvars,iVar3,
               &local_18);
    iVar3._M_current =
         (mvars->super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>).
         _M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    *iVar3._M_current = local_18;
    iVar3._M_current =
         (mvars->super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>).
         _M_impl.super__Vector_impl_data._M_finish + 1;
    (mvars->super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>).
    _M_impl.super__Vector_impl_data._M_finish = iVar3._M_current;
  }
  local_18 = *(ChVariables **)&(this->super_ChNodeFEAxyzD).field_0x138;
  if (iVar3._M_current ==
      (mvars->super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<chrono::ChVariables*,std::allocator<chrono::ChVariables*>>::
    _M_realloc_insert<chrono::ChVariables*>
              ((vector<chrono::ChVariables*,std::allocator<chrono::ChVariables*>> *)mvars,iVar3,
               &local_18);
  }
  else {
    *iVar3._M_current = local_18;
    pppCVar1 = &(mvars->
                super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>).
                _M_impl.super__Vector_impl_data._M_finish;
    *pppCVar1 = *pppCVar1 + 1;
  }
  return;
}

Assistant:

virtual void LoadableGetVariables(std::vector<ChVariables*>& mvars) override {
        mvars.push_back(&Variables());
        mvars.push_back(&Variables_D());
        mvars.push_back(&Variables_DD());
    }